

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cryptohelper_test.cpp
# Opt level: O2

void __thiscall test::test_load_and_export_private::test_method(test_load_and_export_private *this)

{
  locale *Loc;
  long *local_118;
  undefined1 local_110 [8];
  undefined1 local_108 [8];
  string pk_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0;
  undefined8 local_98;
  shared_count sStack_90;
  string pk_exported;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  undefined **local_38;
  undefined1 local_30;
  undefined1 *local_28;
  char *local_20;
  
  license::CryptoHelper::getInstance();
  loadPrivateKey_abi_cxx11_();
  (**(code **)(*local_118 + 0x20))(local_118,&pk_str);
  (**(code **)(*local_118 + 8))(&pk_exported);
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/test/cryptohelper_test.cpp"
  ;
  local_40 = "";
  Loc = (locale *)&local_58;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_48,0x46);
  std::locale::locale((locale *)local_108);
  boost::algorithm::trim_copy<std::__cxx11::string>
            (&local_c0,(algorithm *)&pk_exported,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,Loc);
  std::locale::locale((locale *)local_110);
  boost::algorithm::trim_copy<std::__cxx11::string>
            (&local_e0,(algorithm *)&pk_str,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,Loc);
  local_a0 = std::operator==(&local_c0,&local_e0);
  local_98 = 0;
  sStack_90.pi_ = (sp_counted_base *)0x0;
  local_30 = 0;
  local_38 = &PTR__lazy_ostream_00541d70;
  local_28 = boost::unit_test::lazy_ostream::inst;
  local_20 = "imported and exported keys are the same";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_90);
  std::__cxx11::string::~string((string *)&local_e0);
  std::locale::~locale((locale *)local_110);
  std::__cxx11::string::~string((string *)&local_c0);
  std::locale::~locale((locale *)local_108);
  std::__cxx11::string::~string((string *)&pk_exported);
  std::__cxx11::string::~string((string *)&pk_str);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_load_and_export_private) {
	unique_ptr<CryptoHelper> crypto(CryptoHelper::getInstance());
	const std::string pk_str = loadPrivateKey();
	crypto->loadPrivateKey(pk_str);
	std::string pk_exported = crypto->exportPrivateKey();
	// cout<<pk_str<<endl;
	// cout<<pk_exported<<endl;
	BOOST_CHECK_MESSAGE(boost::trim_copy(pk_exported) == boost::trim_copy(pk_str),
						"imported and exported keys are the same");
	crypto.release();
}